

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sigs.h
# Opt level: O1

void __thiscall
sigs::BasicSignal<void_(),_std::lock_guard<std::mutex>_>::clear
          (BasicSignal<void_(),_std::lock_guard<std::mutex>_> *this)

{
  int iVar1;
  _Any_data local_38;
  code *local_28;
  code *local_20;
  
  iVar1 = pthread_mutex_lock((pthread_mutex_t *)&this->entriesMutex);
  if (iVar1 == 0) {
    local_38._M_unused._M_object = (void *)0x0;
    local_38._8_8_ = 0;
    local_20 = std::
               _Function_handler<bool_(__gnu_cxx::__normal_iterator<sigs::BasicSignal<void_(),_std::lock_guard<std::mutex>_>::Entry_*,_std::vector<sigs::BasicSignal<void_(),_std::lock_guard<std::mutex>_>::Entry,_std::allocator<sigs::BasicSignal<void_(),_std::lock_guard<std::mutex>_>::Entry>_>_>),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/netromdk[P]sigs/sigs.h:471:73)>
               ::_M_invoke;
    local_28 = std::
               _Function_handler<bool_(__gnu_cxx::__normal_iterator<sigs::BasicSignal<void_(),_std::lock_guard<std::mutex>_>::Entry_*,_std::vector<sigs::BasicSignal<void_(),_std::lock_guard<std::mutex>_>::Entry,_std::allocator<sigs::BasicSignal<void_(),_std::lock_guard<std::mutex>_>::Entry>_>_>),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/netromdk[P]sigs/sigs.h:471:73)>
               ::_M_manager;
    eraseEntries(this,(function<bool_(__gnu_cxx::__normal_iterator<sigs::BasicSignal<void_(),_std::lock_guard<std::mutex>_>::Entry_*,_std::vector<sigs::BasicSignal<void_(),_std::lock_guard<std::mutex>_>::Entry,_std::allocator<sigs::BasicSignal<void_(),_std::lock_guard<std::mutex>_>::Entry>_>_>)>
                       *)&local_38);
    if (local_28 != (code *)0x0) {
      (*local_28)(&local_38,&local_38,__destroy_functor);
    }
    pthread_mutex_unlock((pthread_mutex_t *)&this->entriesMutex);
    return;
  }
  std::__throw_system_error(iVar1);
}

Assistant:

void clear() noexcept
  {
    Lock lock(entriesMutex);
    eraseEntries();
  }